

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O1

Vector3f __thiscall eos::fitting::RenderingParameters::get_yaw_pitch_roll(RenderingParameters *this)

{
  undefined1 auVar1 [16];
  Matrix<float,_3,_1,_0,_3,_1> *res;
  long in_RSI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar9;
  float fVar10;
  undefined1 auVar8 [16];
  float fVar11;
  float fVar12;
  Vector3f VVar13;
  
  auVar8 = *(undefined1 (*) [16])(in_RSI + 0x20);
  fVar2 = auVar8._12_4_ * auVar8._12_4_ + auVar8._4_4_ * auVar8._4_4_ +
          auVar8._8_4_ * auVar8._8_4_ + auVar8._0_4_ * auVar8._0_4_;
  if (0.0 < fVar2) {
    fVar2 = SQRT(fVar2);
    auVar1._4_4_ = fVar2;
    auVar1._0_4_ = fVar2;
    auVar1._8_4_ = fVar2;
    auVar1._12_4_ = fVar2;
    auVar8 = divps(auVar8,auVar1);
  }
  fVar7 = auVar8._0_4_;
  fVar9 = auVar8._4_4_;
  fVar10 = auVar8._8_4_;
  fVar11 = auVar8._12_4_;
  fVar3 = fVar9 + fVar9;
  fVar5 = fVar10 + fVar10;
  fVar4 = fVar11 * (fVar7 + fVar7);
  fVar2 = (fVar7 + fVar7) * fVar7;
  fVar12 = fVar7 * fVar3 + fVar11 * fVar5;
  fVar6 = 1.0 - (fVar5 * fVar10 + fVar2);
  fVar2 = atan2f(fVar7 * fVar5 + fVar11 * fVar3,1.0 - (fVar3 * fVar9 + fVar2));
  this->camera_type = (CameraType)fVar2;
  fVar6 = SQRT(fVar12 * fVar12 + fVar6 * fVar6);
  if (fVar2 < 0.0) {
    this->camera_type = (CameraType)(fVar2 + 3.1415927);
    fVar6 = -fVar6;
  }
  fVar2 = atan2f(-(fVar9 * fVar5 - fVar4),fVar6);
  (this->frustum).l = fVar2;
  fVar2 = (float)this->camera_type;
  fVar6 = sinf(fVar2);
  fVar12 = cosf(fVar2);
  fVar3 = atan2f((fVar9 * fVar5 + fVar4) * fVar6 - (fVar7 * fVar3 - fVar11 * fVar5) * fVar12,
                 (1.0 - (fVar3 * fVar9 + fVar5 * fVar10)) * fVar12 -
                 (fVar7 * fVar5 - fVar11 * fVar3) * fVar6);
  (this->frustum).r = fVar3;
  fVar6 = (this->frustum).l;
  if (1.5707964 < ABS(fVar6)) {
    fVar4 = fVar2;
    if (!NAN(fVar2)) {
      fVar4 = (float)(int)((uint)(0.0 < fVar2) - (uint)(fVar2 < 0.0));
    }
    this->camera_type = (CameraType)(fVar2 - fVar4 * 3.1415927);
    fVar6 = fVar6 - (float)(int)((uint)(0.0 < fVar6) - (uint)(fVar6 < 0.0)) * 3.1415927;
    (this->frustum).l = fVar6;
    fVar2 = fVar3;
    if (!NAN(fVar3)) {
      fVar2 = (float)(int)((uint)(0.0 < fVar3) - (uint)(fVar3 < 0.0));
    }
    (this->frustum).r = fVar3 + fVar2 * -3.1415927;
    (this->frustum).l = -fVar6;
  }
  this->camera_type = (CameraType)((float)this->camera_type * 57.29578);
  VVar13.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (this->frustum).l * 57.29578;
  (this->frustum).l =
       VVar13.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  VVar13.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (this->frustum).r * 57.29578;
  (this->frustum).r =
       VVar13.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  VVar13.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] = 0.0
  ;
  return (Vector3f)
         VVar13.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array;
}

Assistant:

Eigen::Vector3f get_yaw_pitch_roll()
    {
        // We use Eigen's Matrix3::eulerAngles() function with axes (1, 0, 2). In our coordinate system, the x
        // axis is to the right, y up, and z into/out of the screen. So to get yaw first, our first axis is y
        // ('1'), then our x axis ('0') to get pitch, then our z axis ('2') to get roll.
        // We are guessing that the function returns intrinsic angles (the unsupported EulerAngles() module
        // does, but it's an unrelated module).
        // Because eulerAngles() constrains the angles in a different way to what we want, we correct for
        // that in tait_bryan_angles() (which calls eulerAngles() and then modifies the solution accordingly).
        Eigen::Vector3f ea = fitting::tait_bryan_angles(rotation.normalized().toRotationMatrix(), 1, 0, 2);
        ea(0) = core::degrees(ea(0));
        ea(1) = core::degrees(ea(1));
        ea(2) = core::degrees(ea(2));
        return ea;
    }